

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O2

const_iterator __thiscall
chaiscript::Type_Conversions::find_bidir(Type_Conversions *this,Type_Info *to,Type_Info *from)

{
  _Rb_tree_const_iterator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_> _Var1;
  
  _Var1 = std::
          __find_if<std::_Rb_tree_const_iterator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>,__gnu_cxx::__ops::_Iter_pred<chaiscript::Type_Conversions::find_bidir(chaiscript::Type_Info_const&,chaiscript::Type_Info_const&)const::_lambda(std::shared_ptr<chaiscript::detail::Type_Conversion_Base>const&)_1_>>
                    (*(undefined8 *)(this + 0x50),this + 0x40,to,from);
  return (const_iterator)_Var1._M_node;
}

Assistant:

std::set<std::shared_ptr<detail::Type_Conversion_Base>>::const_iterator find_bidir(const Type_Info &to, const Type_Info &from) const {
      return std::find_if(m_conversions.begin(),
                          m_conversions.end(),
                          [&to, &from](const std::shared_ptr<detail::Type_Conversion_Base> &conversion) -> bool {
                            return (conversion->to().bare_equal(to) && conversion->from().bare_equal(from))
                                || (conversion->bidir() && conversion->from().bare_equal(to) && conversion->to().bare_equal(from));
                          });
    }